

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeLinkInterface
          (cmGeneratorTarget *this,string *config,cmOptionalLinkInterface *iface,
          cmGeneratorTarget *headTarget,bool secondPass)

{
  pointer pcVar1;
  pointer pcVar2;
  cmGeneratorTarget *this_00;
  bool bVar3;
  TargetType TVar4;
  PolicyStatus PVar5;
  cmLinkImplementationLibraries *pcVar6;
  cmLinkImplementation *pcVar7;
  cmValue cVar8;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range3;
  cmLinkItem *lib;
  cmLinkItem *__v;
  pointer __v_00;
  pair<std::_Rb_tree_iterator<cmLinkItem>,_bool> pVar9;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> emitted;
  string suffix;
  string propName;
  cmAlphaNum local_60;
  
  if ((iface->super_cmLinkInterface).field_0xf5 == '\x01') {
    TVar4 = GetType(this);
    if (((TVar4 == SHARED_LIBRARY) || (TVar4 = GetType(this), TVar4 == STATIC_LIBRARY)) ||
       (TVar4 = GetType(this), TVar4 == INTERFACE_LIBRARY)) {
      emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
      emitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           emitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pcVar1 = (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
               super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
               super__Vector_impl_data._M_finish;
      emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (__v = (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
                 super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                 super__Vector_impl_data._M_start; __v != pcVar1; __v = __v + 1) {
        std::
        _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
        ::_M_insert_unique<cmLinkItem_const&>
                  ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                    *)&emitted,__v);
      }
      TVar4 = GetType(this);
      if (TVar4 != INTERFACE_LIBRARY) {
        pcVar7 = GetLinkImplementation(this,config,Link,secondPass);
        pcVar2 = (pcVar7->super_cmLinkImplementationLibraries).Libraries.
                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (__v_00 = (pcVar7->super_cmLinkImplementationLibraries).Libraries.
                      super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                      super__Vector_impl_data._M_start; __v_00 != pcVar2; __v_00 = __v_00 + 1) {
          pVar9 = std::
                  _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                  ::_M_insert_unique<cmLinkItem_const&>
                            ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                              *)&emitted,&__v_00->super_cmLinkItem);
          if (((((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
              (this_00 = (__v_00->super_cmLinkItem).Target, this_00 != (cmGeneratorTarget *)0x0)) &&
             (TVar4 = GetType(this_00), TVar4 == SHARED_LIBRARY)) {
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::push_back
                      (&(iface->super_cmLinkInterface).SharedDeps,&__v_00->super_cmLinkItem);
          }
        }
      }
      std::
      _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
      ::~_Rb_tree(&emitted._M_t);
    }
  }
  else {
    PVar5 = GetPolicyStatusCMP0022(this);
    if ((PVar5 == WARN) || (PVar5 = GetPolicyStatusCMP0022(this), PVar5 == OLD)) {
      pcVar6 = GetLinkImplementationLibrariesInternal(this,config,headTarget,Link);
      (iface->super_cmLinkInterface).ImplementationIsInterface = true;
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::operator=
                (&(iface->super_cmLinkInterface).WrongConfigLibraries,&pcVar6->WrongConfigLibraries)
      ;
    }
  }
  bVar3 = LinkLanguagePropagatesToDependents(this);
  if ((bVar3) &&
     (pcVar7 = GetLinkImplementation(this,config,Link,secondPass),
     pcVar7 != (cmLinkImplementation *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(iface->super_cmLinkInterface).Languages,&pcVar7->Languages);
  }
  TVar4 = GetType(this);
  if (TVar4 != STATIC_LIBRARY) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&suffix,"_",(allocator<char> *)&emitted);
  if (config->_M_string_length == 0) {
    std::__cxx11::string::append((char *)&suffix);
  }
  else {
    cmsys::SystemTools::UpperCase((string *)&emitted,config);
    std::__cxx11::string::append((string *)&suffix);
    std::__cxx11::string::~string((string *)&emitted);
  }
  emitted._M_t._M_impl._0_8_ = 0x1b;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)"IMPORTED_LINK_INTERFACE_MULTIPLICITY" + 9;
  local_60.View_._M_len = suffix._M_string_length;
  local_60.View_._M_str = suffix._M_dataplus._M_p;
  cmStrCat<>(&propName,(cmAlphaNum *)&emitted,&local_60);
  cVar8 = GetProperty(this,&propName);
  if (cVar8.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&emitted,"LINK_INTERFACE_MULTIPLICITY",(allocator<char> *)&local_60);
    cVar8 = GetProperty(this,(string *)&emitted);
    std::__cxx11::string::~string((string *)&emitted);
    if (cVar8.Value == (string *)0x0) goto LAB_0034fff2;
  }
  __isoc99_sscanf(((cVar8.Value)->_M_dataplus)._M_p,"%u",
                  &(iface->super_cmLinkInterface).Multiplicity);
LAB_0034fff2:
  std::__cxx11::string::~string((string *)&propName);
  std::__cxx11::string::~string((string *)&suffix);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkInterface(
  const std::string& config, cmOptionalLinkInterface& iface,
  cmGeneratorTarget const* headTarget, bool secondPass) const
{
  if (iface.Explicit) {
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Shared libraries may have runtime implementation dependencies
      // on other shared libraries that are not in the interface.
      std::set<cmLinkItem> emitted;
      for (cmLinkItem const& lib : iface.Libraries) {
        emitted.insert(lib);
      }
      if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
        cmLinkImplementation const* impl = this->GetLinkImplementation(
          config, LinkInterfaceFor::Link, secondPass);
        for (cmLinkImplItem const& lib : impl->Libraries) {
          if (emitted.insert(lib).second) {
            if (lib.Target) {
              // This is a runtime dependency on another shared library.
              if (lib.Target->GetType() == cmStateEnums::SHARED_LIBRARY) {
                iface.SharedDeps.push_back(lib);
              }
            } else {
              // TODO: Recognize shared library file names.  Perhaps this
              // should be moved to cmComputeLinkInformation, but that
              // creates a chicken-and-egg problem since this list is needed
              // for its construction.
            }
          }
        }
      }
    }
  } else if (this->GetPolicyStatusCMP0022() == cmPolicies::WARN ||
             this->GetPolicyStatusCMP0022() == cmPolicies::OLD) {
    // The link implementation is the default link interface.
    cmLinkImplementationLibraries const* impl =
      this->GetLinkImplementationLibrariesInternal(config, headTarget,
                                                   LinkInterfaceFor::Link);
    iface.ImplementationIsInterface = true;
    iface.WrongConfigLibraries = impl->WrongConfigLibraries;
  }

  if (this->LinkLanguagePropagatesToDependents()) {
    // Targets using this archive need its language runtime libraries.
    if (cmLinkImplementation const* impl = this->GetLinkImplementation(
          config, LinkInterfaceFor::Link, secondPass)) {
      iface.Languages = impl->Languages;
    }
  }

  if (this->GetType() == cmStateEnums::STATIC_LIBRARY) {
    // Construct the property name suffix for this configuration.
    std::string suffix = "_";
    if (!config.empty()) {
      suffix += cmSystemTools::UpperCase(config);
    } else {
      suffix += "NOCONFIG";
    }

    // How many repetitions are needed if this library has cyclic
    // dependencies?
    std::string propName = cmStrCat("LINK_INTERFACE_MULTIPLICITY", suffix);
    if (cmValue config_reps = this->GetProperty(propName)) {
      sscanf(config_reps->c_str(), "%u", &iface.Multiplicity);
    } else if (cmValue reps =
                 this->GetProperty("LINK_INTERFACE_MULTIPLICITY")) {
      sscanf(reps->c_str(), "%u", &iface.Multiplicity);
    }
  }
}